

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlElementContentPtr xmlParseElementMixedContentDecl(xmlParserCtxtPtr ctxt,int inputchk)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlParserErrors error;
  xmlParserInputPtr pxVar3;
  xmlElementContentPtr pxVar4;
  xmlElementContentPtr pxVar5;
  xmlElementContentPtr pxVar6;
  xmlChar *pxVar7;
  xmlDocPtr doc;
  xmlElementContentPtr pxVar8;
  xmlElementContentPtr pxVar9;
  
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  pxVar3 = ctxt->input;
  pxVar7 = pxVar3->cur;
  if (((((*pxVar7 == '#') && (pxVar7[1] == 'P')) && (pxVar7[2] == 'C')) &&
      ((pxVar7[3] == 'D' && (pxVar7[4] == 'A')))) && ((pxVar7[5] == 'T' && (pxVar7[6] == 'A')))) {
    pxVar3->cur = pxVar7 + 7;
    pxVar3->col = pxVar3->col + 7;
    if (pxVar7[7] == '\0') {
      xmlParserInputGrow(pxVar3,0xfa);
    }
    xmlSkipBlankChars(ctxt);
    pxVar3 = ctxt->input;
    if (((ctxt->progressive == 0) && (500 < (long)pxVar3->cur - (long)pxVar3->base)) &&
       ((long)pxVar3->end - (long)pxVar3->cur < 500)) {
      xmlSHRINK(ctxt);
      pxVar3 = ctxt->input;
    }
    xVar1 = *pxVar3->cur;
    if ((xVar1 == '(') || (xVar1 == '|')) {
      pxVar4 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_PCDATA);
      if (pxVar4 == (xmlElementContentPtr)0x0) {
        return (xmlElementContentPtr)0x0;
      }
    }
    else {
      if (xVar1 == ')') {
        if (pxVar3->id != inputchk) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "Element content declaration doesn\'t start and stop in the same entity\n")
          ;
        }
        xmlNextChar(ctxt);
        pxVar4 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_PCDATA);
        if (pxVar4 == (xmlElementContentPtr)0x0) {
          return (xmlElementContentPtr)0x0;
        }
        if (*ctxt->input->cur != '*') {
          return pxVar4;
        }
        pxVar4->ocur = XML_ELEMENT_CONTENT_MULT;
        xmlNextChar(ctxt);
        return pxVar4;
      }
      pxVar4 = (xmlElementContentPtr)0x0;
    }
    pxVar7 = (xmlChar *)0x0;
    pxVar8 = pxVar4;
    while( true ) {
      pxVar2 = ctxt->input->cur;
      xVar1 = *pxVar2;
      if (xVar1 != '|') break;
      if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015b950;
      xmlNextChar(ctxt);
      pxVar5 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_OR);
      if (pxVar7 == (xmlChar *)0x0) {
        if (pxVar5 == (xmlElementContentPtr)0x0) {
          doc = ctxt->myDoc;
          pxVar4 = pxVar8;
          goto LAB_0015b97f;
        }
        pxVar5->c1 = pxVar8;
        pxVar6 = pxVar8;
        pxVar9 = pxVar5;
        pxVar4 = pxVar5;
        if (pxVar8 != (xmlElementContentPtr)0x0) goto LAB_0015b86a;
      }
      else {
        doc = ctxt->myDoc;
        if (pxVar5 == (xmlElementContentPtr)0x0) goto LAB_0015b97f;
        pxVar6 = xmlNewDocElementContent(doc,pxVar7,XML_ELEMENT_CONTENT_ELEMENT);
        pxVar5->c1 = pxVar6;
        if (pxVar6 != (xmlElementContentPtr)0x0) {
          pxVar6->parent = pxVar5;
        }
        pxVar8->c2 = pxVar5;
        pxVar6 = pxVar5;
        pxVar9 = pxVar8;
LAB_0015b86a:
        pxVar6->parent = pxVar9;
      }
      xmlSkipBlankChars(ctxt);
      pxVar7 = xmlParseName(ctxt);
      if (pxVar7 == (xmlChar *)0x0) {
        xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,
                       "xmlParseElementMixedContentDecl : Name expected\n");
        doc = ctxt->myDoc;
LAB_0015b97f:
        xmlFreeDocElementContent(doc,pxVar4);
        return (xmlElementContentPtr)0x0;
      }
      xmlSkipBlankChars(ctxt);
      pxVar8 = pxVar5;
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
    }
    if ((xVar1 == ')') && (pxVar2[1] == '*')) {
      if (pxVar7 != (xmlChar *)0x0) {
        pxVar5 = xmlNewDocElementContent(ctxt->myDoc,pxVar7,XML_ELEMENT_CONTENT_ELEMENT);
        pxVar8->c2 = pxVar5;
        if (pxVar5 != (xmlElementContentPtr)0x0) {
          pxVar5->parent = pxVar8;
        }
      }
      if (pxVar4 != (xmlElementContentPtr)0x0) {
        pxVar4->ocur = XML_ELEMENT_CONTENT_MULT;
      }
      pxVar3 = ctxt->input;
      if (pxVar3->id != inputchk) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn\'t start and stop in the same entity\n");
        pxVar3 = ctxt->input;
      }
      pxVar7 = pxVar3->cur;
      pxVar3->cur = pxVar7 + 2;
      pxVar3->col = pxVar3->col + 2;
      if (pxVar7[2] != '\0') {
        return pxVar4;
      }
      xmlParserInputGrow(pxVar3,0xfa);
      return pxVar4;
    }
LAB_0015b950:
    xmlFreeDocElementContent(ctxt->myDoc,pxVar4);
    error = XML_ERR_MIXED_NOT_STARTED;
  }
  else {
    error = XML_ERR_PCDATA_REQUIRED;
  }
  xmlFatalErr(ctxt,error,(char *)0x0);
  return (xmlElementContentPtr)0x0;
}

Assistant:

xmlElementContentPtr
xmlParseElementMixedContentDecl(xmlParserCtxtPtr ctxt, int inputchk) {
    xmlElementContentPtr ret = NULL, cur = NULL, n;
    const xmlChar *elem = NULL;

    GROW;
    if (CMP7(CUR_PTR, '#', 'P', 'C', 'D', 'A', 'T', 'A')) {
	SKIP(7);
	SKIP_BLANKS;
	SHRINK;
	if (RAW == ')') {
	    if (ctxt->input->id != inputchk) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element content declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    NEXT;
	    ret = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_PCDATA);
	    if (ret == NULL)
	        return(NULL);
	    if (RAW == '*') {
		ret->ocur = XML_ELEMENT_CONTENT_MULT;
		NEXT;
	    }
	    return(ret);
	}
	if ((RAW == '(') || (RAW == '|')) {
	    ret = cur = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_PCDATA);
	    if (ret == NULL) return(NULL);
	}
	while ((RAW == '|') && (ctxt->instate != XML_PARSER_EOF)) {
	    NEXT;
	    if (elem == NULL) {
	        ret = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
		if (ret == NULL) {
		    xmlFreeDocElementContent(ctxt->myDoc, cur);
                    return(NULL);
                }
		ret->c1 = cur;
		if (cur != NULL)
		    cur->parent = ret;
		cur = ret;
	    } else {
	        n = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
		if (n == NULL) {
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
                    return(NULL);
                }
		n->c1 = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
		if (n->c1 != NULL)
		    n->c1->parent = n;
	        cur->c2 = n;
		if (n != NULL)
		    n->parent = cur;
		cur = n;
	    }
	    SKIP_BLANKS;
	    elem = xmlParseName(ctxt);
	    if (elem == NULL) {
		xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			"xmlParseElementMixedContentDecl : Name expected\n");
		xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    SKIP_BLANKS;
	    GROW;
	}
	if ((RAW == ')') && (NXT(1) == '*')) {
	    if (elem != NULL) {
		cur->c2 = xmlNewDocElementContent(ctxt->myDoc, elem,
		                               XML_ELEMENT_CONTENT_ELEMENT);
		if (cur->c2 != NULL)
		    cur->c2->parent = cur;
            }
            if (ret != NULL)
                ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    if (ctxt->input->id != inputchk) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element content declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    SKIP(2);
	} else {
	    xmlFreeDocElementContent(ctxt->myDoc, ret);
	    xmlFatalErr(ctxt, XML_ERR_MIXED_NOT_STARTED, NULL);
	    return(NULL);
	}

    } else {
	xmlFatalErr(ctxt, XML_ERR_PCDATA_REQUIRED, NULL);
    }
    return(ret);
}